

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmidiin.cpp
# Opt level: O3

int main(int argc,char **param_2)

{
  bool bVar1;
  undefined8 extraout_RAX;
  long *plVar2;
  int extraout_EDX;
  RtMidiIn *unaff_RBX;
  char input;
  long *local_40 [2];
  long local_30 [2];
  
  if (argc < 3) {
    unaff_RBX = (RtMidiIn *)operator_new(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"RtMidi Input Client","");
    RtMidiIn::RtMidiIn(unaff_RBX,0,local_40,100);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    bVar1 = chooseMidiPort(unaff_RBX);
    if (bVar1) {
      MidiInApi::setCallback(*(_func_void_double_vector_ptr_void_ptr **)(unaff_RBX + 8),mycallback);
      (**(code **)(**(long **)(unaff_RBX + 8) + 0x58))(*(long **)(unaff_RBX + 8),0,0,0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nReading MIDI input ... press <enter> to quit.\n",0x2f);
      std::istream::get((char *)&std::cin);
    }
  }
  else {
    usage();
    if (extraout_EDX != 1) {
      _Unwind_Resume(extraout_RAX);
    }
    plVar2 = (long *)__cxa_begin_catch();
    (**(code **)(*plVar2 + 0x18))(plVar2);
    __cxa_end_catch();
    if (unaff_RBX == (RtMidiIn *)0x0) {
      return 0;
    }
  }
  (**(code **)(*(long *)unaff_RBX + 0x40))(unaff_RBX);
  return 0;
}

Assistant:

int main( int argc, char ** /*argv[]*/ )
{
  RtMidiIn *midiin = 0;

  // Minimal command-line check.
  if ( argc > 2 ) usage();

  try {

    // RtMidiIn constructor
    midiin = new RtMidiIn();

    // Call function to select port.
    if ( chooseMidiPort( midiin ) == false ) goto cleanup;

    // Set our callback function.  This should be done immediately after
    // opening the port to avoid having incoming messages written to the
    // queue instead of sent to the callback function.
    midiin->setCallback( &mycallback );

    // Don't ignore sysex, timing, or active sensing messages.
    midiin->ignoreTypes( false, false, false );

    std::cout << "\nReading MIDI input ... press <enter> to quit.\n";
    char input;
    std::cin.get(input);

  } catch ( RtMidiError &error ) {
    error.printMessage();
  }

 cleanup:

  delete midiin;

  return 0;
}